

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

int Potassco::xconvert(char *x,bool *out,char **errPos,int param_4)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  undefined1 *in_RSI;
  char *in_RDI;
  char *local_10;
  int local_4;
  
  bVar1 = empty(in_RDI,in_RDX);
  if (bVar1) {
    local_4 = 0;
  }
  else {
    if (*in_RDI == '1') {
      *in_RSI = 1;
      local_10 = in_RDI + 1;
    }
    else if (*in_RDI == '0') {
      *in_RSI = 0;
      local_10 = in_RDI + 1;
    }
    else {
      iVar2 = strncmp(in_RDI,"no",2);
      if (iVar2 == 0) {
        *in_RSI = 0;
        local_10 = in_RDI + 2;
      }
      else {
        iVar2 = strncmp(in_RDI,"on",2);
        if (iVar2 == 0) {
          *in_RSI = 1;
          local_10 = in_RDI + 2;
        }
        else {
          iVar2 = strncmp(in_RDI,"yes",3);
          if (iVar2 == 0) {
            *in_RSI = 1;
            local_10 = in_RDI + 3;
          }
          else {
            iVar2 = strncmp(in_RDI,"off",3);
            if (iVar2 == 0) {
              *in_RSI = 0;
              local_10 = in_RDI + 3;
            }
            else {
              iVar2 = strncmp(in_RDI,"true",4);
              if (iVar2 == 0) {
                *in_RSI = 1;
                local_10 = in_RDI + 4;
              }
              else {
                iVar2 = strncmp(in_RDI,"false",5);
                local_10 = in_RDI;
                if (iVar2 == 0) {
                  *in_RSI = 0;
                  local_10 = in_RDI + 5;
                }
              }
            }
          }
        }
      }
    }
    local_4 = parsed(1,local_10,in_RDX);
  }
  return local_4;
}

Assistant:

int xconvert(const char* x, bool& out, const char** errPos, int) {
	if      (empty(x, errPos))           { return 0; }
	else if (*x == '1')                  { out = true;  x += 1; }
	else if (*x == '0')                  { out = false; x += 1; }
	else if (strncmp(x, "no", 2)  == 0)  { out = false; x += 2; }
	else if (strncmp(x, "on", 2)  == 0)  { out = true;  x += 2; }
	else if (strncmp(x, "yes", 3) == 0)  { out = true;  x += 3; }
	else if (strncmp(x, "off", 3) == 0)  { out = false; x += 3; }
	else if (strncmp(x, "true", 4) == 0) { out = true;  x += 4; }
	else if (strncmp(x, "false", 5) == 0){ out = false; x += 5; }
	return parsed(1, x, errPos);
}